

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O3

NucleusPtr __thiscall trento::Nucleus::create(Nucleus *this,string *species,double nucleon_dmin)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  WoodsSaxonNucleus *this_00;
  pointer pNVar4;
  pointer pdVar5;
  invalid_argument *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar3 = std::__cxx11::string::compare((char *)species);
  if (iVar3 == 0) {
    this_00 = (WoodsSaxonNucleus *)operator_new(0x28);
    (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
         (_func_int **)&PTR__Nucleus_001319a0;
    (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pNVar4 = (pointer)operator_new(0x38);
    (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
    super__Vector_impl_data._M_start = pNVar4;
    (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pNVar4 + 1;
    (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
    super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar4 + 1;
    pNVar4->is_participant_ = false;
    pNVar4->constituents_exist_ = false;
    *(undefined6 *)&pNVar4->field_0x1a = 0;
    (pNVar4->constituents_).
    super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
    *(pointer *)
     ((long)&(pNVar4->constituents_).
             super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
             ._M_impl + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(pNVar4->constituents_).
             super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
             ._M_impl + 0x10) = (pointer)0x0;
    (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
    pNVar4->x_ = 0.0;
    pNVar4->y_ = 0.0;
    pNVar4->z_ = 0.0;
    pNVar4->is_participant_ = false;
    pNVar4->constituents_exist_ = false;
    *(undefined6 *)&pNVar4->field_0x1a = 0;
    (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
         (_func_int **)&PTR__Nucleus_001319d0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)species);
    if (iVar3 == 0) {
      this_00 = (WoodsSaxonNucleus *)operator_new(0x38);
      (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
           (_func_int **)&PTR__Nucleus_001319a0;
      (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar4 = (pointer)operator_new(0x70);
      (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_start = pNVar4;
      *(pointer *)
       ((long)&(pNVar4->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl + 0x10) = (pointer)0x0;
      pNVar4[1].x_ = 0.0;
      pNVar4[1].y_ = 0.0;
      pNVar4[1].z_ = 0.0;
      pNVar4[1].is_participant_ = false;
      pNVar4[1].constituents_exist_ = false;
      *(undefined6 *)&pNVar4[1].field_0x1a = 0;
      pNVar4[1].constituents_.
      super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
      *(pointer *)
       ((long)&pNVar4[1].constituents_.
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl + 8) = (pointer)0x0;
      *(pointer *)
       ((long)&pNVar4[1].constituents_.
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl + 0x10) = (pointer)0x0;
      pNVar4->x_ = 0.0;
      pNVar4->y_ = 0.0;
      pNVar4->z_ = 0.0;
      pNVar4->is_participant_ = false;
      pNVar4->constituents_exist_ = false;
      *(undefined6 *)&pNVar4->field_0x1a = 0;
      (pNVar4->constituents_).
      super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
      *(pointer *)
       ((long)&(pNVar4->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl + 8) = (pointer)0x0;
      *(pointer *)
       ((long)&(pNVar4->constituents_).
               super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
               ._M_impl + 0x10) = (pointer)0x0;
      pNVar4[1].x_ = 0.0;
      auVar1 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3fdd3f7ced916873);
      (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pNVar4 + 2;
      (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
      super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
      super__Vector_impl_data._M_finish = pNVar4 + 2;
      (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
           (_func_int **)&PTR__Nucleus_00131a00;
      *(undefined1 (*) [16])&(this_00->super_MinDistNucleus).super_Nucleus.offset_ = auVar1;
      this_00->R_ = 2.35;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)species);
      if (iVar3 == 0) {
        this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
        WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0x3f,4.2,0.596,nucleon_dmin);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)species);
        if (iVar3 == 0) {
          this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
          (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
               (_func_int **)&PTR__Nucleus_001319a0;
          (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pNVar4 = (pointer)operator_new(0xdc8);
          (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
          super__Vector_impl_data._M_start = pNVar4;
          (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pNVar4 + 0x3f;
          memset(pNVar4,0,0xdc8);
          (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
          super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
          super__Vector_impl_data._M_finish = pNVar4 + 0x3f;
          (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
          (this_00->super_MinDistNucleus).dminsq_ = nucleon_dmin * nucleon_dmin;
          (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
               (_func_int **)&PTR__Nucleus_00131a60;
          this_00->R_ = 4.2;
          this_00->a_ = 0.596;
          (this_00->woods_saxon_dist_)._M_param._M_int.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x3fc4bc6a7ef9db23;
          (this_00->woods_saxon_dist_)._M_param._M_int.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0xbf789374bc6a7efa;
          pdVar5 = (pointer)0x4025385b5b70691f;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)species);
          if (iVar3 == 0) {
            this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
            WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0x81,5.36,0.59,nucleon_dmin);
            goto LAB_00120973;
          }
          iVar3 = std::__cxx11::string::compare((char *)species);
          if (iVar3 == 0) {
            this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
            (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                 (_func_int **)&PTR__Nucleus_001319a0;
            (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
            super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
            super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
            super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pNVar4 = (pointer)operator_new(0x1c38);
            (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
            super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
            super__Vector_impl_data._M_start = pNVar4;
            (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
            super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = pNVar4 + 0x81;
            memset(pNVar4,0,0x1c38);
            (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
            super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
            super__Vector_impl_data._M_finish = pNVar4 + 0x81;
            (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
            (this_00->super_MinDistNucleus).dminsq_ = nucleon_dmin * nucleon_dmin;
            (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                 (_func_int **)&PTR__Nucleus_00131a60;
            this_00->R_ = 5.36;
            this_00->a_ = 0.59;
            (this_00->woods_saxon_dist_)._M_param._M_int.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x3fc4bc6a7ef9db23;
            (this_00->woods_saxon_dist_)._M_param._M_int.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0xbf689374bc6a7efa;
            pdVar5 = (pointer)0x4027a4340c7706c8;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)species);
            if (iVar3 == 0) {
              this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
              WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0xc5,6.38,0.535,nucleon_dmin);
              goto LAB_00120973;
            }
            iVar3 = std::__cxx11::string::compare((char *)species);
            if (iVar3 == 0) {
              this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
              (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                   (_func_int **)&PTR__Nucleus_001319a0;
              (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
              super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
              super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
              super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              pNVar4 = (pointer)operator_new(0x2b18);
              (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
              super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
              super__Vector_impl_data._M_start = pNVar4;
              (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
              super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = pNVar4 + 0xc5;
              memset(pNVar4,0,0x2b18);
              (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
              super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
              super__Vector_impl_data._M_finish = pNVar4 + 0xc5;
              (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
              (this_00->super_MinDistNucleus).dminsq_ = nucleon_dmin * nucleon_dmin;
              (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                   (_func_int **)&PTR__Nucleus_00131a60;
              this_00->R_ = 6.38;
              this_00->a_ = 0.535;
              (this_00->woods_saxon_dist_)._M_param._M_int.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0xbfc0c49ba5e353f8;
              (this_00->woods_saxon_dist_)._M_param._M_int.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)0xbf9fbe76c8b43958;
              pdVar5 = (pointer)0x4028d96c4d30347c;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)species);
              if (iVar3 == 0) {
                this_00 = (WoodsSaxonNucleus *)operator_new(0xa0);
                WoodsSaxonNucleus::WoodsSaxonNucleus(this_00,0xd0,6.62,0.546,nucleon_dmin);
                goto LAB_00120973;
              }
              iVar3 = std::__cxx11::string::compare((char *)species);
              if (iVar3 == 0) {
                this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                     (_func_int **)&PTR__Nucleus_001319a0;
                (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                pNVar4 = (pointer)operator_new(0x3410);
                (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                _M_impl.super__Vector_impl_data._M_start = pNVar4;
                (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = pNVar4 + 0xee;
                memset(pNVar4,0,0x3410);
                (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                _M_impl.super__Vector_impl_data._M_finish = pNVar4 + 0xee;
                (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
                (this_00->super_MinDistNucleus).dminsq_ = nucleon_dmin * nucleon_dmin;
                (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                     (_func_int **)&PTR__Nucleus_00131a60;
                this_00->R_ = 6.81;
                this_00->a_ = 0.6;
                (this_00->woods_saxon_dist_)._M_param._M_int.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x3fd1eb851eb851ec;
                (this_00->woods_saxon_dist_)._M_param._M_int.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x3fb7ced916872b02;
                pdVar5 = (pointer)0x402d1967125dd096;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)species);
                if (iVar3 == 0) {
                  this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                  (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                       (_func_int **)&PTR__Nucleus_001319a0;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  pNVar4 = (pointer)operator_new(0x3410);
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_start = pNVar4;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = pNVar4 + 0xee;
                  memset(pNVar4,0,0x3410);
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_finish = pNVar4 + 0xee;
                  (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
                  (this_00->super_MinDistNucleus).dminsq_ = nucleon_dmin * nucleon_dmin;
                  (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                       (_func_int **)&PTR__Nucleus_00131a60;
                  this_00->R_ = 6.86;
                  this_00->a_ = 0.42;
                  (this_00->woods_saxon_dist_)._M_param._M_int.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x3fd0f5c28f5c28f6;
                  (this_00->woods_saxon_dist_)._M_param._M_int.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  pdVar5 = (pointer)0x4028691a11233df3;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)species);
                  if (iVar3 != 0) {
                    bVar2 = hdf5::filename_is_hdf5(species);
                    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    if (bVar2) {
                      std::invalid_argument::invalid_argument
                                (this_01,"HDF5 output was not compiled");
                      __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                                  std::invalid_argument::~invalid_argument);
                    }
                    std::operator+(&local_40,"unknown projectile species: ",species);
                    std::invalid_argument::invalid_argument(this_01,(string *)&local_40);
                    __cxa_throw(this_01,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  this_00 = (WoodsSaxonNucleus *)operator_new(0x58);
                  (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                       (_func_int **)&PTR__Nucleus_001319a0;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  pNVar4 = (pointer)operator_new(0x3410);
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_start = pNVar4;
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = pNVar4 + 0xee;
                  memset(pNVar4,0,0x3410);
                  (this_00->super_MinDistNucleus).super_Nucleus.nucleons_.
                  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>.
                  _M_impl.super__Vector_impl_data._M_finish = pNVar4 + 0xee;
                  (this_00->super_MinDistNucleus).super_Nucleus.offset_ = 0.0;
                  (this_00->super_MinDistNucleus).dminsq_ = nucleon_dmin * nucleon_dmin;
                  (this_00->super_MinDistNucleus).super_Nucleus._vptr_Nucleus =
                       (_func_int **)&PTR__Nucleus_00131a60;
                  pdVar5 = (pointer)0x40298c364388ebcd;
                  this_00->R_ = 6.67;
                  this_00->a_ = 0.44;
                  (this_00->woods_saxon_dist_)._M_param._M_int.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x3fd1eb851eb851ec;
                  (this_00->woods_saxon_dist_)._M_param._M_int.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x3fb7ced916872b02;
                }
              }
            }
          }
        }
        (this_00->woods_saxon_dist_)._M_param._M_int.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pdVar5;
      }
    }
  }
LAB_00120973:
  this->_vptr_Nucleus = (_func_int **)this_00;
  return (__uniq_ptr_data<trento::Nucleus,_std::default_delete<trento::Nucleus>,_true,_true>)
         (__uniq_ptr_data<trento::Nucleus,_std::default_delete<trento::Nucleus>,_true,_true>)this;
}

Assistant:

NucleusPtr Nucleus::create(const std::string& species, double nucleon_dmin) {
  // W-S params ref. in header
  // XXX: remember to add new species to the help output in main() and the readme
  if (species == "p")
    return NucleusPtr{new Proton{}};
  else if (species == "d")
    return NucleusPtr{new Deuteron{}};
  else if (species == "Cu")
    return NucleusPtr{new WoodsSaxonNucleus{
       63, 4.20, 0.596, nucleon_dmin
    }};
  else if (species == "Cu2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
       63, 4.20, 0.596, 0.162, -0.006, nucleon_dmin
    }};
  else if (species == "Xe")
    return NucleusPtr{new WoodsSaxonNucleus{
      129, 5.36, 0.590, nucleon_dmin
    }};
  else if (species == "Xe2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      129, 5.36, 0.590, 0.162, -0.003, nucleon_dmin
    }};
  else if (species == "Au")
    return NucleusPtr{new WoodsSaxonNucleus{
      197, 6.38, 0.535, nucleon_dmin
    }};
  else if (species == "Au2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      197, 6.38, 0.535, -0.131, -0.031, nucleon_dmin
    }};
  else if (species == "Pb")
    return NucleusPtr{new WoodsSaxonNucleus{
      208, 6.62, 0.546, nucleon_dmin
    }};
  else if (species == "U")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.81, 0.600, 0.280, 0.093, nucleon_dmin
    }};
  else if (species == "U2")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.86, 0.420, 0.265, 0.000, nucleon_dmin
    }};
  else if (species == "U3")
    return NucleusPtr{new DeformedWoodsSaxonNucleus{
      238, 6.67, 0.440, 0.280, 0.093, nucleon_dmin
    }};
  // Read nuclear configurations from HDF5.
  else if (hdf5::filename_is_hdf5(species)) {
#ifdef TRENTO_HDF5
    return ManualNucleus::create(species);
#else
    throw std::invalid_argument{"HDF5 output was not compiled"};
#endif  // TRENTO_HDF5
  }
  else
    throw std::invalid_argument{"unknown projectile species: " + species};
}